

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ark_harmonic_symplectic.h
# Opt level: O1

void PrintHelp(void)

{
  fwrite("ark_harmonic_symplectic: an ARKODE example demonstrating the SPRKStep time-stepping module solving a simple harmonic oscillator\n"
         ,0x80,1,_stderr);
  fprintf(_stderr,"  --order <int>               the order of the method to use (default %d)\n",4);
  fprintf(_stderr,"  --dt <Real>                 the fixed-time step size to use (default %.1Le)\n")
  ;
  fprintf(_stderr,"  --nout <int>                the number of output times (default %d)\n",8);
  fwrite("  --use-compensated-sums      turns on compensated summation in ARKODE where applicable\n"
         ,0x58,1,_stderr);
  fwrite("  --disable-tstop             turns off tstop mode\n",0x33,1,_stderr);
  return;
}

Assistant:

static void PrintHelp(void)
{
  ProgramArgs defaults;
  SetDefaultArgs(&defaults);
  fprintf(stderr, "ark_harmonic_symplectic: an ARKODE example demonstrating "
                  "the SPRKStep time-stepping module solving a simple harmonic "
                  "oscillator\n");
  /* clang-format off */
  fprintf(stderr, "  --order <int>               the order of the method to use (default %d)\n",
    defaults.order);
  fprintf(stderr, "  --dt <Real>                 the fixed-time step size to use (default %.1Le)\n",
    (long double)defaults.dt);
  fprintf(stderr, "  --nout <int>                the number of output times (default %d)\n",
    defaults.num_output_times);
  fprintf(stderr, "  --use-compensated-sums      turns on compensated summation in ARKODE where applicable\n");
  fprintf(stderr, "  --disable-tstop             turns off tstop mode\n");
  /* clang-format on */
}